

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Transformation * __thiscall
TransformParser::parse(Transformation *__return_storage_ptr__,TransformParser *this)

{
  char cVar1;
  bool bVar2;
  Transformation *t1;
  Transformation *t0;
  float fVar3;
  float fVar4;
  float local_134;
  StringView local_130;
  undefined8 local_120;
  Transformation local_118;
  float local_fc;
  float local_f8;
  float local_e0;
  float local_dc;
  float local_d8;
  Transformation local_c0;
  Transformation local_a8;
  Transformation local_88;
  Transformation local_68;
  string local_50;
  
  __return_storage_ptr__->a = 1.0;
  __return_storage_ptr__->b = 0.0;
  __return_storage_ptr__->c = 0.0;
  __return_storage_ptr__->d = 1.0;
  __return_storage_ptr__->e = 0.0;
  __return_storage_ptr__->f = 0.0;
  Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  do {
    if ((this->super_Parser).s.size == 0) {
      return __return_storage_ptr__;
    }
    bVar2 = Parser::parse(&this->super_Parser,"matrix");
    if (bVar2) {
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      local_130.s = "(";
      local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
      Parser::expect(&this->super_Parser,&local_130);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      fVar3 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_f8 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_d8 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_fc = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_dc = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
      local_e0 = Parser::parse_number(&this->super_Parser);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      local_130.s = ")";
      local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
      Parser::expect(&this->super_Parser,&local_130);
      local_118.b = local_f8;
      local_118.c = local_d8;
      local_118.d = local_fc;
      local_118.e = local_dc;
      local_118.a = fVar3;
      local_118.f = local_e0;
LAB_00107747:
      operator*(__return_storage_ptr__,&local_118);
      __return_storage_ptr__->e = (float)(undefined4)local_120;
      __return_storage_ptr__->f = (float)local_120._4_4_;
      *(char **)__return_storage_ptr__ = local_130.s;
      __return_storage_ptr__->c = (float)(undefined4)local_130.size;
      __return_storage_ptr__->d = (float)local_130.size._4_4_;
    }
    else {
      bVar2 = Parser::parse(&this->super_Parser,"translate");
      if (bVar2) {
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        local_130.s = "(";
        local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
        Parser::expect(&this->super_Parser,&local_130);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        local_f8 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        local_134 = 0.0;
        if (((this->super_Parser).s.size != 0) &&
           (cVar1 = *(this->super_Parser).s.s, cVar1 == '-' || (byte)(cVar1 - 0x30U) < 10)) {
          local_134 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        }
        local_130.s = ")";
        local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
        Parser::expect(&this->super_Parser,&local_130);
        local_118.a = 1.0;
        local_118.b = 0.0;
        local_118.c = 0.0;
        local_118.d = 1.0;
        local_118.e = local_f8;
        local_118.f = local_134;
        goto LAB_00107747;
      }
      bVar2 = Parser::parse(&this->super_Parser,"scale");
      if (bVar2) {
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        local_130.s = "(";
        local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
        Parser::expect(&this->super_Parser,&local_130);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        fVar4 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        fVar3 = fVar4;
        if (((this->super_Parser).s.size != 0) &&
           (cVar1 = *(this->super_Parser).s.s, cVar1 == '-' || (byte)(cVar1 - 0x30U) < 10)) {
          local_f8 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          fVar3 = local_f8;
        }
        local_130.s = ")";
        local_f8 = fVar3;
        local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
        Parser::expect(&this->super_Parser,&local_130);
        local_118.b = 0.0;
        local_118.c = 0.0;
        local_118.d = local_f8;
        local_118.e = 0.0;
        local_118.f = 0.0;
        local_118.a = fVar4;
        goto LAB_00107747;
      }
      bVar2 = Parser::parse(&this->super_Parser,"rotate");
      if (!bVar2) {
        bVar2 = Parser::parse(&this->super_Parser,"skewX");
        if (bVar2) {
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          local_130.s = "(";
          local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
          Parser::expect(&this->super_Parser,&local_130);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          fVar3 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          local_130.s = ")";
          local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
          Parser::expect(&this->super_Parser,&local_130);
          local_118.c = tanf(fVar3 * 0.017453292);
          local_118.a = 1.0;
          local_118.b = 0.0;
          local_118.d = 1.0;
          local_118.e = 0.0;
          local_118.f = 0.0;
        }
        else {
          bVar2 = Parser::parse(&this->super_Parser,"skewY");
          if (!bVar2) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_50,"unexpected transformation",(allocator<char> *)&local_130
                      );
            Parser::error(&this->super_Parser,&local_50);
          }
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          local_130.s = "(";
          local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
          Parser::expect(&this->super_Parser,&local_130);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          fVar3 = Parser::parse_number(&this->super_Parser);
          Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
          local_130.s = ")";
          local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
          Parser::expect(&this->super_Parser,&local_130);
          local_118.b = tanf(fVar3 * 0.017453292);
          local_118.a = 1.0;
          local_118.c = 0.0;
          local_118.d = 1.0;
          local_118.e = 0.0;
          local_118.f = 0.0;
        }
        goto LAB_00107747;
      }
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      local_130.s = "(";
      local_130.size = StringView::strlen((StringView *)"(",(char *)0x0);
      Parser::expect(&this->super_Parser,&local_130);
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      fVar3 = Parser::parse_number(&this->super_Parser);
      fVar3 = fVar3 * 0.017453292;
      Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
      if (((this->super_Parser).s.size == 0) ||
         (cVar1 = *(this->super_Parser).s.s, cVar1 != '-' && 9 < (byte)(cVar1 - 0x30U))) {
        local_f8 = cosf(fVar3);
        local_118.b = sinf(fVar3);
        local_118.a = local_f8;
        local_118.c = -local_118.b;
        local_118.d = local_f8;
        local_118.e = 0.0;
        local_118.f = 0.0;
        t1 = &local_118;
        t0 = __return_storage_ptr__;
      }
      else {
        local_f8 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space_or_comma);
        local_d8 = Parser::parse_number(&this->super_Parser);
        Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
        local_a8.a = 1.0;
        local_a8.b = 0.0;
        local_a8.c = 0.0;
        local_a8.d = 1.0;
        local_a8.e = local_f8;
        local_a8.f = local_d8;
        operator*(__return_storage_ptr__,&local_a8);
        local_fc = cosf(fVar3);
        local_c0.b = sinf(fVar3);
        local_c0.a = local_fc;
        local_c0.c = -local_c0.b;
        local_c0.d = local_fc;
        local_c0.e = 0.0;
        local_c0.f = 0.0;
        operator*(&local_68,&local_c0);
        local_88.a = 1.0;
        local_88.b = 0.0;
        local_88.c = 0.0;
        local_88.d = 1.0;
        local_88._16_8_ = CONCAT44(local_d8,local_f8) ^ 0x8000000080000000;
        t1 = &local_88;
        t0 = &local_118;
      }
      operator*(t0,t1);
      __return_storage_ptr__->e = (float)(undefined4)local_120;
      __return_storage_ptr__->f = (float)local_120._4_4_;
      *(char **)__return_storage_ptr__ = local_130.s;
      __return_storage_ptr__->c = (float)(undefined4)local_130.size;
      __return_storage_ptr__->d = (float)local_130.size._4_4_;
      local_130.s = ")";
      local_130.size = StringView::strlen((StringView *)0x10fdef,(char *)0x0);
      Parser::expect(&this->super_Parser,&local_130);
    }
    Parser::parse_all<bool(&)(Character)>(&this->super_Parser,Parser::white_space);
  } while( true );
}

Assistant:

Transformation parse() {
		Transformation t;
		parse_all(white_space);
		while (has_next()) {
			if (parse("matrix")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number();
				parse_all(white_space_or_comma);
				const float b = parse_number();
				parse_all(white_space_or_comma);
				const float c = parse_number();
				parse_all(white_space_or_comma);
				const float d = parse_number();
				parse_all(white_space_or_comma);
				const float e = parse_number();
				parse_all(white_space_or_comma);
				const float f = parse_number();
				parse_all(white_space);
				expect(")");
				t = t * Transformation(a, b, c, d, e, f);
			}
			else if (parse("translate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = 0.f;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::translate(x, y);
			}
			else if (parse("scale")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float x = parse_number();
				parse_all(white_space_or_comma);
				float y = x;
				if (copy().parse(number_start_char)) {
					y = parse_number();
					parse_all(white_space);
				}
				expect(")");
				t = t * Transformation::scale(x, y);
			}
			else if (parse("rotate")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				if (copy().parse(number_start_char)) {
					const float x = parse_number();
					parse_all(white_space_or_comma);
					const float y = parse_number();
					parse_all(white_space);
					t = t * Transformation::translate(x, y) * Transformation::rotate(a) * Transformation::translate(-x, -y);
				}
				else {
					t = t * Transformation::rotate(a);
				}
				expect(")");
			}
			else if (parse("skewX")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, 0.f, std::tan(a), 1.f, 0.f, 0.f);
			}
			else if (parse("skewY")) {
				parse_all(white_space);
				expect("(");
				parse_all(white_space);
				const float a = parse_number() * (M_PI / 180.f);
				parse_all(white_space);
				expect(")");
				t = t * Transformation(1.f, std::tan(a), 0.f, 1.f, 0.f, 0.f);
			}
			else {
				error("unexpected transformation");
			}
			parse_all(white_space);
		}
		return t;
	}